

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::SetNavWindow(ImGuiWindow *window)

{
  ImGuiContext *pIVar1;
  ImGuiContext *pIVar2;
  bool bVar3;
  char *pcVar4;
  
  pIVar1 = GImGui;
  pIVar2 = GImGui;
  if (GImGui->NavWindow != window) {
    if ((GImGui->DebugLogFlags & 2) != 0) {
      if (window == (ImGuiWindow *)0x0) {
        pcVar4 = "<NULL>";
      }
      else {
        pcVar4 = window->Name;
      }
      DebugLog("[focus] SetNavWindow(\"%s\")\n",pcVar4);
    }
    pIVar2 = GImGui;
    pIVar1->NavWindow = window;
  }
  pIVar1->NavMoveSubmitted = false;
  pIVar1->NavMoveScoringItems = false;
  pIVar1->NavInitRequest = false;
  bVar3 = true;
  if (pIVar2->NavMoveScoringItems == false) {
    bVar3 = pIVar2->NavInitRequest;
  }
  pIVar2->NavAnyRequest = bVar3;
  return;
}

Assistant:

void ImGui::SetNavWindow(ImGuiWindow* window)
{
    ImGuiContext& g = *GImGui;
    if (g.NavWindow != window)
    {
        IMGUI_DEBUG_LOG_FOCUS("[focus] SetNavWindow(\"%s\")\n", window ? window->Name : "<NULL>");
        g.NavWindow = window;
    }
    g.NavInitRequest = g.NavMoveSubmitted = g.NavMoveScoringItems = false;
    NavUpdateAnyRequestFlag();
}